

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

int WebRtcIsac_DecodeSpec
              (Bitstr *streamdata,int16_t AvgPitchGain_Q12,ISACBand band,double *fr,double *fi)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  bool local_ad1;
  int local_ad0;
  int32_t local_acc;
  int32_t p2;
  int32_t p1;
  int num_dft_coeff;
  int is_12khz;
  int i;
  int len;
  int k;
  int32_t newRes;
  int32_t in_sqrt;
  int32_t res;
  int32_t gain2_Q10;
  int16_t gainQ10;
  int16_t RCQ15 [6];
  int16_t ARCoefQ12 [7];
  uint16_t invARSpecQ8 [120];
  int32_t invARSpec2_Q16 [120];
  int16_t data [480];
  int16_t DitherQ7 [480];
  double *local_30;
  double *fi_local;
  double *fr_local;
  ISACBand band_local;
  int16_t AvgPitchGain_Q12_local;
  Bitstr *streamdata_local;
  
  p1._0_2_ = 0;
  p2 = 0x1e0;
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(data + 0x1dc,streamdata->W_upper,0x1e0,AvgPitchGain_Q12);
  }
  else {
    GenerateDitherQ7LbUB(data + 0x1dc,streamdata->W_upper,0x1e0);
    if (band == kIsacUpperBand12) {
      p2 = 0xf0;
    }
    p1._0_2_ = (ushort)(band == kIsacUpperBand12);
  }
  iVar2 = WebRtcIsac_DecodeRc(streamdata,(int16_t *)((long)&res + 2));
  if (iVar2 < 0) {
    streamdata_local._4_4_ = -0x1a22;
  }
  else {
    WebRtcSpl_ReflCoefToLpc((int16_t *)((long)&res + 2),6,RCQ15 + 2);
    iVar2 = WebRtcIsac_DecodeGain2(streamdata,&in_sqrt);
    if (iVar2 < 0) {
      streamdata_local._4_4_ = -0x1a22;
    }
    else {
      FindInvArSpec(RCQ15 + 2,in_sqrt,(int32_t *)(invARSpecQ8 + 0x74));
      iVar1 = WebRtcSpl_GetSizeInBits(invARSpecQ8._232_4_);
      newRes = 1 << ((byte)(iVar1 >> 1) & 0x1f);
      for (i = 0; i < 0x78; i = i + 1) {
        k = invARSpec2_Q16[(long)i + -2];
        num_dft_coeff = 10;
        if (k < 0) {
          k = -k;
        }
        len = k / newRes + newRes >> 1;
        do {
          iVar2 = num_dft_coeff;
          newRes = len;
          iVar3 = k / len + len >> 1;
          if (iVar3 != len) {
            num_dft_coeff = num_dft_coeff + -1;
          }
          local_ad1 = iVar3 != len && 0 < iVar2;
          len = iVar3;
        } while (local_ad1);
        ARCoefQ12[(long)i + 3] = (int16_t)iVar3;
      }
      streamdata_local._4_4_ =
           WebRtcIsac_DecLogisticMulti2
                     ((int16_t *)(invARSpec2_Q16 + 0x76),streamdata,(uint16_t *)(ARCoefQ12 + 3),
                      data + 0x1dc,p2,(ushort)p1);
      if (streamdata_local._4_4_ < 1) {
        streamdata_local._4_4_ = -0x1a22;
      }
      else if (band == kIsacLowerBand) {
        if (AvgPitchGain_Q12 < 0x267) {
          local_acc = 0x7800;
          local_ad0 = 0x218000;
        }
        else {
          local_acc = 0x9000;
          local_ad0 = 0x288000;
        }
        local_30 = fi;
        fi_local = fr;
        for (i = 0; i < 0x1e0; i = i + 4) {
          res._0_2_ = WebRtcSpl_DivW32W16ResW16
                                (local_acc,
                                 (int16_t)((uint)(invARSpec2_Q16[(long)(i >> 2) + -2] + local_ad0)
                                          >> 0x10));
          pdVar4 = fi_local + 1;
          *fi_local = (double)((int)data[(long)i + -4] * (int)(int16_t)res + 0x200 >> 10) / 128.0;
          pdVar5 = local_30 + 1;
          *local_30 = (double)((int)data[(long)(i + 1) + -4] * (int)(int16_t)res + 0x200 >> 10) /
                      128.0;
          fi_local = fi_local + 2;
          *pdVar4 = (double)((int)data[(long)(i + 2) + -4] * (int)(int16_t)res + 0x200 >> 10) /
                    128.0;
          local_30 = local_30 + 2;
          *pdVar5 = (double)((int)data[(long)(i + 3) + -4] * (int)(int16_t)res + 0x200 >> 10) /
                    128.0;
        }
      }
      else if (band == kIsacUpperBand12) {
        num_dft_coeff = 0;
        for (i = 0; i < 0xf0; i = i + 4) {
          fr[num_dft_coeff] = (double)(int)data[(long)i + -4] * 0.0078125;
          fi[num_dft_coeff] = (double)(int)data[(long)i + -3] * 0.0078125;
          fr[num_dft_coeff + 1] = (double)(int)data[(long)i + -2] * 0.0078125;
          fi[num_dft_coeff + 1] = (double)(int)data[(long)i + -1] / 128.0;
          num_dft_coeff = num_dft_coeff + 2;
        }
        memset(fr + 0x78,0,0x3c0);
        memset(fi + 0x78,0,0x3c0);
      }
      else if (band == kIsacUpperBand16) {
        num_dft_coeff = 0;
        for (i = 0; i < 0x1e0; i = i + 4) {
          fr[num_dft_coeff] = (double)(int)data[(long)i + -4] * 0.0078125;
          fi[num_dft_coeff] = (double)(int)data[(long)i + -3] * 0.0078125;
          fr[0xef - num_dft_coeff] = (double)(int)data[(long)i + -2] * 0.0078125;
          fi[0xef - num_dft_coeff] = (double)(int)data[(long)i + -1] / 128.0;
          num_dft_coeff = num_dft_coeff + 1;
        }
      }
    }
  }
  return streamdata_local._4_4_;
}

Assistant:

int WebRtcIsac_DecodeSpec(Bitstr* streamdata, int16_t AvgPitchGain_Q12,
                          enum ISACBand band, double* fr, double* fi) {
  int16_t  DitherQ7[FRAMESAMPLES];
  int16_t  data[FRAMESAMPLES];
  int32_t  invARSpec2_Q16[FRAMESAMPLES_QUARTER];
  uint16_t invARSpecQ8[FRAMESAMPLES_QUARTER];
  int16_t  ARCoefQ12[AR_ORDER + 1];
  int16_t  RCQ15[AR_ORDER];
  int16_t  gainQ10;
  int32_t  gain2_Q10, res;
  int32_t  in_sqrt;
  int32_t  newRes;
  int k, len, i;
  int is_12khz = !kIsSWB12;
  int num_dft_coeff = FRAMESAMPLES;
  /* Create dither signal. */
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(DitherQ7, streamdata->W_upper, FRAMESAMPLES,
                       AvgPitchGain_Q12);
  } else {
    GenerateDitherQ7LbUB(DitherQ7, streamdata->W_upper, FRAMESAMPLES);
    if (band == kIsacUpperBand12) {
      is_12khz = kIsSWB12;
      num_dft_coeff = FRAMESAMPLES_HALF;
    }
  }

  /* Decode model parameters. */
  if (WebRtcIsac_DecodeRc(streamdata, RCQ15) < 0)
    return -ISAC_RANGE_ERROR_DECODE_SPECTRUM;

  WebRtcSpl_ReflCoefToLpc(RCQ15, AR_ORDER, ARCoefQ12);

  if (WebRtcIsac_DecodeGain2(streamdata, &gain2_Q10) < 0)
    return -ISAC_RANGE_ERROR_DECODE_SPECTRUM;

  /* Compute inverse AR power spectrum. */
  FindInvArSpec(ARCoefQ12, gain2_Q10, invARSpec2_Q16);

  /* Convert to magnitude spectrum,
   * by doing square-roots (modified from SPLIB). */
  res = 1 << (WebRtcSpl_GetSizeInBits(invARSpec2_Q16[0]) >> 1);
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    in_sqrt = invARSpec2_Q16[k];
    i = 10;

    /* Negative values make no sense for a real sqrt-function. */
    if (in_sqrt < 0)
      in_sqrt = -in_sqrt;

    newRes = (in_sqrt / res + res) >> 1;
    do {
      res = newRes;
      newRes = (in_sqrt / res + res) >> 1;
    } while (newRes != res && i-- > 0);

    invARSpecQ8[k] = (int16_t)newRes;
  }

  len = WebRtcIsac_DecLogisticMulti2(data, streamdata, invARSpecQ8, DitherQ7,
                                     num_dft_coeff, is_12khz);
  /* Arithmetic decoding of spectrum. */
  if (len < 1) {
    return -ISAC_RANGE_ERROR_DECODE_SPECTRUM;
  }

  switch (band) {
    case kIsacLowerBand: {
      /* Scale down spectral samples with low SNR. */
      int32_t p1;
      int32_t p2;
      if (AvgPitchGain_Q12 <= 614) {
        p1 = 30 << 10;
        p2 = 32768 + (33 << 16);
      } else {
        p1 = 36 << 10;
        p2 = 32768 + (40 << 16);
      }
      for (k = 0; k < FRAMESAMPLES; k += 4) {
        gainQ10 = WebRtcSpl_DivW32W16ResW16(p1, (int16_t)(
            (invARSpec2_Q16[k >> 2] + p2) >> 16));
        *fr++ = (double)((data[ k ] * gainQ10 + 512) >> 10) / 128.0;
        *fi++ = (double)((data[k + 1] * gainQ10 + 512) >> 10) / 128.0;
        *fr++ = (double)((data[k + 2] * gainQ10 + 512) >> 10) / 128.0;
        *fi++ = (double)((data[k + 3] * gainQ10 + 512) >> 10) / 128.0;
      }
      break;
    }
    case kIsacUpperBand12: {
      for (k = 0, i = 0; k < FRAMESAMPLES_HALF; k += 4) {
        fr[i] = (double)data[ k ] / 128.0;
        fi[i] = (double)data[k + 1] / 128.0;
        i++;
        fr[i] = (double)data[k + 2] / 128.0;
        fi[i] = (double)data[k + 3] / 128.0;
        i++;
      }
      /* The second half of real and imaginary coefficients is zero. This is
       * due to using the old FFT module which requires two signals as input
       * while in 0-12 kHz mode we only have 8-12 kHz band, and the second
       * signal is set to zero. */
      memset(&fr[FRAMESAMPLES_QUARTER], 0, FRAMESAMPLES_QUARTER *
             sizeof(double));
      memset(&fi[FRAMESAMPLES_QUARTER], 0, FRAMESAMPLES_QUARTER *
             sizeof(double));
      break;
    }
    case kIsacUpperBand16: {
      for (i = 0, k = 0; k < FRAMESAMPLES; k += 4, i++) {
        fr[i] = (double)data[ k ] / 128.0;
        fi[i] = (double)data[k + 1] / 128.0;
        fr[(FRAMESAMPLES_HALF) - 1 - i] = (double)data[k + 2] / 128.0;
        fi[(FRAMESAMPLES_HALF) - 1 - i] = (double)data[k + 3] / 128.0;
      }
      break;
    }
  }
  return len;
}